

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_getparam.c
# Opt level: O1

ParameterError getstr(char **str,char *val,_Bool allowblank)

{
  char *pcVar1;
  
  if (*str != (char *)0x0) {
    free(*str);
    *str = (char *)0x0;
  }
  if (val != (char *)0x0) {
    if ((!allowblank) && (*val == '\0')) {
      return PARAM_BLANK_STRING;
    }
    pcVar1 = strdup(val);
    *str = pcVar1;
    if (pcVar1 == (char *)0x0) {
      return PARAM_NO_MEM;
    }
  }
  return PARAM_OK;
}

Assistant:

static ParameterError getstr(char **str, const char *val, bool allowblank)
{
  if(*str) {
    free(*str);
    *str = NULL;
  }
  if(val) {
    if(!allowblank && !val[0])
      return PARAM_BLANK_STRING;

    *str = strdup(val);
    if(!*str)
      return PARAM_NO_MEM;
  }
  return PARAM_OK;
}